

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

int boost::xpressive::detail::
    toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,traits<char> *tr,int radix,int max)

{
  bool bVar1;
  reference pcVar2;
  int iVar3;
  ulong in_RCX;
  undefined7 uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int in_R8D;
  int c;
  int i;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int local_38;
  uint local_34;
  
  iVar3 = (int)in_RCX;
  local_34 = 0;
  local_38 = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    uVar4 = (undefined7)(in_RCX >> 8);
    in_stack_ffffffffffffffc7 = false;
    if (bVar1) {
      in_stack_ffffffffffffffb8 = in_RDX;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(in_RDI);
      local_38 = (**(code **)(in_stack_ffffffffffffffb8->_M_current + 0x28))
                           (in_stack_ffffffffffffffb8,(int)*pcVar2,iVar3,CONCAT71(uVar4,*pcVar2));
      in_stack_ffffffffffffffc7 = local_38 != -1;
    }
    if ((bool)in_stack_ffffffffffffffc7 == false) break;
    local_34 = local_38 + iVar3 * local_34;
    in_RCX = (ulong)local_34;
    if (in_R8D < (int)local_34) {
      return (int)local_34 / iVar3;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_RDI);
  }
  return local_34;
}

Assistant:

int toi(InIter &begin, InIter end, Traits const &tr, int radix = 10, int max = INT_MAX)
{
    detail::ignore_unused(tr);
    int i = 0, c = 0;
    for(; begin != end && -1 != (c = tr.value(*begin, radix)); ++begin)
    {
        if(max < ((i *= radix) += c))
            return i / radix;
    }
    return i;
}